

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_exit_code(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b;
  int64_t eval_a;
  
  init_process_options("spawn_helper1",exit_cb);
  puVar2 = uv_default_loop();
  iVar1 = uv_spawn(puVar2,&process,&options);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      eval_a = 1;
      eval_b = (int64_t)exit_cb_called;
      if (eval_b == 1) {
        eval_a = 1;
        eval_b = (int64_t)close_cb_called;
        if (eval_b == 1) {
          puVar2 = uv_default_loop();
          close_loop(puVar2);
          eval_a = 0;
          puVar2 = uv_default_loop();
          iVar1 = uv_loop_close(puVar2);
          eval_b = (int64_t)iVar1;
          if (eval_b == 0) {
            uv_library_shutdown();
            return 0;
          }
          pcVar5 = "uv_loop_close(uv_default_loop())";
          pcVar4 = "0";
          uVar3 = 0x11b;
        }
        else {
          pcVar5 = "close_cb_called";
          pcVar4 = "1";
          uVar3 = 0x119;
        }
      }
      else {
        pcVar5 = "exit_cb_called";
        pcVar4 = "1";
        uVar3 = 0x118;
      }
    }
    else {
      pcVar5 = "0";
      pcVar4 = "r";
      uVar3 = 0x116;
    }
  }
  else {
    pcVar5 = "0";
    pcVar4 = "r";
    uVar3 = 0x113;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
          ,uVar3,pcVar4,"==",pcVar5,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(spawn_exit_code) {
  int r;

  init_process_options("spawn_helper1", exit_cb);

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}